

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O0

Font * __thiscall ResourceManager::getFont(ResourceManager *this,path *filename)

{
  format_string_t<const_ghc::filesystem::path_&> fmt;
  bool bVar1;
  byte bVar2;
  pointer ppVar3;
  mapped_type *__lhs;
  runtime_error *this_00;
  Font *newFont;
  iterator font;
  map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
  *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  key_type *in_stack_ffffffffffffff28;
  map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
  *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff50;
  Font *in_stack_ffffffffffffff58;
  string local_a0 [48];
  string local_70 [32];
  mapped_type *local_50;
  basic_string_view<char> local_48;
  _Self local_38;
  _Self local_30 [3];
  mapped_type *local_18;
  char *local_10;
  basic_string_view<char> *local_8;
  
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
       ::find(in_stack_fffffffffffffee8,(key_type *)0x203595);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
       ::end(in_stack_fffffffffffffee8);
  bVar1 = std::operator!=(local_30,&local_38);
  if (bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_ghc::filesystem::path,_sf::Font>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_ghc::filesystem::path,_sf::Font>_> *)
                        0x2035db);
    local_18 = &ppVar3->second;
  }
  else {
    local_8 = &local_48;
    local_10 = "ResourceManager loading font {}.";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (local_8,"ResourceManager loading font {}.",0x20);
    fmt.str.size_ = in_stack_ffffffffffffff00;
    fmt.str.data_ = in_stack_fffffffffffffef8;
    spdlog::debug<ghc::filesystem::path_const&>
              (fmt,(path *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    __lhs = std::
            map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
            ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_50 = __lhs;
    ghc::filesystem::path::string_abi_cxx11_((path *)__lhs);
    bVar1 = sf::Font::loadFromFile(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_70);
    if ((bVar2 & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_((path *)__lhs);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,in_stack_fffffffffffffef0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(bVar2,in_stack_fffffffffffffef0));
      std::runtime_error::runtime_error(this_00,local_a0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_18 = local_50;
  }
  return local_18;
}

Assistant:

sf::Font& ResourceManager::getFont(const fs::path& filename) {
    auto font = fonts_.find(filename);
    if (font != fonts_.end()) {
        return font->second;
    }
    spdlog::debug("ResourceManager loading font {}.", filename);
    sf::Font& newFont = fonts_[filename];
    if (!newFont.loadFromFile(filename.string())) {
        throw std::runtime_error("\"" + filename.string() + "\": unable to load font file.");
    }
    return newFont;
}